

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O0

void __thiscall Parse::SMTLIB2::readAssert(SMTLIB2 *this,LExpr *body)

{
  bool bVar1;
  undefined8 uVar2;
  Unit *in_RDI;
  FormulaUnit *fu;
  Formula *fla;
  ParseResult res;
  bool in_stack_000006bf;
  LExpr *in_stack_000006c0;
  SMTLIB2 *in_stack_000006c8;
  string *in_stack_fffffffffffffe68;
  UserErrorException *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  FIFO *this_00;
  FromInput local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  ParseResult *in_stack_fffffffffffffea8;
  Inference *in_stack_fffffffffffffeb0;
  Formula *in_stack_fffffffffffffeb8;
  FormulaUnit *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 outerParentheses;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 uVar3;
  Inference *local_50;
  FIFO local_48 [4];
  
  outerParentheses = (undefined1)((ulong)in_stack_fffffffffffffed0 >> 0x38);
  in_RDI[2]._inference.th_ancestors = 0.0;
  this_00 = local_48;
  parseTermOrFormula(in_stack_000006c8,in_stack_000006c0,in_stack_000006bf);
  bVar1 = ParseResult::asFormula(in_stack_fffffffffffffea8,(Formula **)in_stack_fffffffffffffea0);
  if (!bVar1) {
    uVar3 = 1;
    uVar2 = __cxa_allocate_exception(0x50);
    Shell::LispParser::Expression::toString_abi_cxx11_
              ((Expression *)CONCAT17(uVar3,in_stack_fffffffffffffed8),(bool)outerParentheses);
    std::operator+((char *)in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    Shell::LispParser::Expression::toString_abi_cxx11_
              ((Expression *)CONCAT17(uVar3,in_stack_fffffffffffffed8),(bool)outerParentheses);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    Lib::UserErrorException::Exception(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    __cxa_throw(uVar2,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  Kernel::FormulaUnit::operator_new(0xa52ef0);
  Kernel::FromInput::FromInput(&local_161,ASSUMPTION);
  Kernel::Inference::Inference(local_50,(FromInput *)in_stack_fffffffffffffe68);
  Kernel::FormulaUnit::FormulaUnit
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  Kernel::Inference::~Inference((Inference *)&stack0xfffffffffffffea0);
  Lib::List<Kernel::Unit_*>::FIFO::pushBack(this_00,in_RDI);
  ParseResult::~ParseResult((ParseResult *)0xa52f7f);
  return;
}

Assistant:

void SMTLIB2::readAssert(LExpr* body)
{
  _nextVar = 0;
  ASS(_scopes.isEmpty());

  ParseResult res = parseTermOrFormula(body,false/*isSort*/);

  Formula* fla;
  if (!res.asFormula(fla)) {
    USER_ERROR_EXPR("Asserted expression of non-boolean sort "+body->toString());
  }

  FormulaUnit* fu = new FormulaUnit(fla, FromInput(UnitInputType::ASSUMPTION));
  _formulas.pushBack(fu);
}